

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# one_valus_inst.c
# Opt level: O2

void i32Popcnt_op(vm *v,instruction *inst)

{
  uint32 uVar1;
  uint uVar2;
  
  uVar1 = popU32(&v->operandStack);
  uVar2 = uVar1 - (uVar1 >> 1 & 0x55555555);
  uVar2 = (uVar2 >> 2 & 0x33333333) + (uVar2 & 0x33333333);
  pushU32(&v->operandStack,((uVar2 >> 4) + uVar2 & 0xf0f0f0f) * 0x1010101 >> 0x18);
  return;
}

Assistant:

void i32Popcnt_op(vm *v, instruction *inst) {
    stack *s = &v->operandStack;
    uint32 val = popU32(s);
    pushU32(s, (uint32) popcount_3((uint64) val));
    
}